

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_ldrddi.cpp
# Opt level: O0

ze_result_t loader::zetMetricGroupCloseExp(zet_metric_group_handle_t hMetricGroup)

{
  zet_pfnMetricGroupCloseExp_t pfnCloseExp;
  dditable_t *dditable;
  ze_result_t result;
  zet_metric_group_handle_t hMetricGroup_local;
  
  if (*(code **)(*(long *)(hMetricGroup + 8) + 0x7a0) == (code *)0x0) {
    hMetricGroup_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hMetricGroup_local._4_4_ =
         (**(code **)(*(long *)(hMetricGroup + 8) + 0x7a0))(*(undefined8 *)hMetricGroup);
  }
  return hMetricGroup_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricGroupCloseExp(
        zet_metric_group_handle_t hMetricGroup          ///< [in] Handle of the metric group
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zet_metric_group_object_t*>( hMetricGroup )->dditable;
        auto pfnCloseExp = dditable->zet.MetricGroupExp.pfnCloseExp;
        if( nullptr == pfnCloseExp )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hMetricGroup = reinterpret_cast<zet_metric_group_object_t*>( hMetricGroup )->handle;

        // forward to device-driver
        result = pfnCloseExp( hMetricGroup );

        return result;
    }